

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O3

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_mir
          (Inline_Func *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined **ppuVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *this_01;
  char cVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Self __tmp_1;
  const_iterator __first;
  Tag *pTVar9;
  char *pcVar10;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  pVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allInlinedFuncs;
  ostream local_199;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  key_type local_178;
  undefined **local_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined1 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  size_t local_c0;
  bool local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_b0;
  MirPackage *local_a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  undefined **local_98;
  undefined8 local_90;
  undefined1 local_88;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  init(this,(EVP_PKEY_CTX *)package);
  local_b0 = &package->functions;
  p_Var5 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      optimize_func(this,&local_80,(MirFunction *)(p_Var5 + 2),local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppuVar3 = (undefined **)(local_108 + 0x10);
  local_108._0_8_ = ppuVar3;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"main","");
  this_00 = &this->uninlined_funcs;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  if ((undefined **)local_108._0_8_ != ppuVar3) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  local_108._0_8_ = ppuVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"f__main","");
  __first._M_node = (_Base_ptr)local_108;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__first._M_node);
  if ((undefined **)local_108._0_8_ != ppuVar3) {
    __first._M_node = (_Base_ptr)(local_108._16_8_ + 1);
    operator_delete((void *)local_108._0_8_,(ulong)__first._M_node);
  }
  p_Var5 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = package;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    local_a0 = &this->uninlineable_funcs;
    do {
      if (*(char *)&p_Var5[3]._M_parent[1]._M_left == '\0') {
        pTVar9 = (Tag *)(p_Var5 + 1);
        __first._M_node = (_Base_ptr)pTVar9;
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,(key_type *)pTVar9);
        if ((_Rb_tree_header *)cVar6._M_node ==
            &(this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header) {
          __first._M_node = (_Base_ptr)pTVar9;
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_a0->_M_t,(key_type *)pTVar9);
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar9);
            __first._M_node = (_Base_ptr)pTVar9;
          }
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  this_01 = local_b0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      pTVar9 = *(Tag **)(p_Var5 + 1);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pTVar9,
                 (byte *)((long)&pTVar9->_vptr_Tag + (long)&(p_Var5[1]._M_parent)->_M_color));
      local_199 = (ostream)0x0;
      AixLog::operator<<(&local_199,(Severity *)pTVar9);
      local_158 = &PTR__Tag_001eaf88;
      local_150 = &local_140;
      local_148 = 0;
      local_140 = 0;
      local_130 = 1;
      AixLog::operator<<((ostream *)&local_158,pTVar9);
      local_90 = std::chrono::_V2::system_clock::now();
      local_98 = &PTR__Timestamp_001eaf58;
      local_88 = 0;
      AixLog::operator<<((ostream *)&local_98,(Timestamp *)pTVar9);
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"optimize_mir","");
      pcVar10 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
      ;
      local_128 = &local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                 ,"");
      local_108._0_8_ = &PTR__Function_001eafb8;
      local_108._8_8_ = &local_f0;
      if (local_198 == &local_188) {
        local_f0._8_8_ = local_188._8_8_;
      }
      else {
        local_108._8_8_ = local_198;
      }
      local_f0._M_allocated_capacity._1_7_ = local_188._M_allocated_capacity._1_7_;
      local_f0._M_local_buf[0] = local_188._M_local_buf[0];
      local_108._16_8_ = local_190;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      if (local_128 == &local_118) {
        local_d0._8_8_ = local_118._8_8_;
      }
      else {
        local_e0._M_p = (pointer)local_128;
      }
      local_d0._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
      local_d0._M_local_buf[0] = local_118._M_local_buf[0];
      local_d8 = local_120;
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_c0 = 0x19f;
      local_b8 = false;
      local_198 = &local_188;
      local_128 = &local_118;
      AixLog::operator<<((ostream *)local_108,(Function *)pcVar10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,local_178._M_dataplus._M_p,
                          local_178._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," is deleted because all of it\'s calls are inlined ",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_108);
      if (local_128 != &local_118) {
        operator_delete(local_128,
                        CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) +
                        1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,
                        CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) +
                        1);
      }
      local_158 = &PTR__Tag_001eaf88;
      if (local_150 != &local_140) {
        operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
      }
      pVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
               ::equal_range(&this_01->_M_t,&local_178);
      __first._M_node = (_Base_ptr)pVar11.first._M_node;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
      ::_M_erase_aux(&this_01->_M_t,__first,(_Base_ptr)pVar11.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        __first._M_node =
             (_Base_ptr)
             (CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                       local_178.field_2._M_local_buf[0]) + 1);
        operator_delete(local_178._M_dataplus._M_p,(ulong)__first._M_node);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  p_Var8 = (local_a8->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    paVar2 = &local_178.field_2;
    do {
      local_98 = (undefined **)((ulong)local_98 & 0xffffffffffffff00);
      AixLog::operator<<((ostream *)&local_98,(Severity *)__first._M_node);
      local_158 = &PTR__Tag_001eaf88;
      local_150 = &local_140;
      local_148 = 0;
      local_140 = 0;
      local_130 = 1;
      AixLog::operator<<((ostream *)&local_158,(Tag *)__first._M_node);
      local_120 = std::chrono::_V2::system_clock::now();
      local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&PTR__Timestamp_001eaf58;
      local_118._M_local_buf[0] = '\0';
      AixLog::operator<<((ostream *)&local_128,(Timestamp *)__first._M_node);
      local_178._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"optimize_mir","");
      pcVar10 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
      ;
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                 ,"");
      local_108._0_8_ = &PTR__Function_001eafb8;
      local_108._8_8_ = &local_f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == paVar2) {
        local_f0._8_8_ = local_178.field_2._8_8_;
      }
      else {
        local_108._8_8_ = local_178._M_dataplus._M_p;
      }
      local_f0._M_allocated_capacity._1_7_ = local_178.field_2._M_allocated_capacity._1_7_;
      local_f0._M_local_buf[0] = local_178.field_2._M_local_buf[0];
      local_108._16_8_ = local_178._M_string_length;
      local_178._M_string_length = 0;
      local_178.field_2._M_local_buf[0] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      if (local_198 == &local_188) {
        local_d0._8_8_ = local_188._8_8_;
      }
      else {
        local_e0._M_p = (pointer)local_198;
      }
      local_d0._M_allocated_capacity._1_7_ = local_188._M_allocated_capacity._1_7_;
      local_d0._M_local_buf[0] = local_188._M_local_buf[0];
      local_d8 = local_190;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_c0 = 0x1a5;
      local_b8 = false;
      local_198 = &local_188;
      local_178._M_dataplus._M_p = (pointer)paVar2;
      AixLog::operator<<((ostream *)local_108,(Function *)pcVar10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(char *)p_Var8[2]._M_parent,(long)p_Var8[2]._M_left)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," variables size is ",0x13);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      __first._M_node = (_Base_ptr)(ulong)(uint)(int)cVar4;
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_108);
      if (local_198 != &local_188) {
        __first._M_node =
             (_Base_ptr)
             (CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1);
        operator_delete(local_198,(ulong)__first._M_node);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar2) {
        __first._M_node =
             (_Base_ptr)
             (CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                       local_178.field_2._M_local_buf[0]) + 1);
        operator_delete(local_178._M_dataplus._M_p,(ulong)__first._M_node);
      }
      local_158 = &PTR__Tag_001eaf88;
      if (local_150 != &local_140) {
        __first._M_node = (_Base_ptr)(CONCAT71(uStack_13f,local_140) + 1);
        operator_delete(local_150,(ulong)__first._M_node);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    init(package);
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->first, iter->second, package.functions);
    }
    std::set<std::string> allInlinedFuncs;
    uninlined_funcs.insert("main");
    uninlined_funcs.insert("f__main");
    for (auto& pair : package.functions) {
      if (pair.second.type->is_extern) continue;
      if (!uninlined_funcs.count(pair.first) &&
          !uninlineable_funcs.count(pair.first)) {
        allInlinedFuncs.insert(pair.first);
      }
    }
    for (auto s : allInlinedFuncs) {
      LOG(TRACE) << s << " is deleted because all of it's calls are inlined "
                 << std::endl;
      package.functions.erase(s);
    }
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      LOG(TRACE) << iter->second.name << " variables size is "
                 << iter->second.variables.size() << std::endl;
    }
  }